

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlCharacters(xmlParserCtxtPtr ctxt,xmlChar *buf,int size,int isBlank)

{
  xmlChar xVar1;
  _xmlSAXHandler *p_Var2;
  xmlDocPtr pxVar3;
  charactersSAXFunc p_Var4;
  xmlNode *node;
  ignorableWhitespaceSAXFunc UNRECOVERED_JUMPTABLE;
  bool bVar5;
  int iVar6;
  void *pvVar7;
  xmlNodePtr pxVar8;
  ulong uVar9;
  xmlChar *pxVar10;
  
  p_Var2 = ctxt->sax;
  if (p_Var2 == (_xmlSAXHandler *)0x0) {
    return;
  }
  if (ctxt->disableSAX != 0) {
    return;
  }
  if ((ctxt->keepBlanks == 0) || (p_Var2->ignorableWhitespace != p_Var2->characters)) {
    bVar5 = true;
    if ((ctxt->space == (int *)0x0) || ((iVar6 = *ctxt->space, iVar6 == -2 || (iVar6 == 1))))
    goto LAB_0013f12f;
    if (0 < size && isBlank == 0) {
      uVar9 = 0;
      do {
        if ((0x20 < (ulong)buf[uVar9]) || ((0x100002600U >> ((ulong)buf[uVar9] & 0x3f) & 1) == 0))
        goto LAB_0013f12f;
        uVar9 = uVar9 + 1;
      } while ((uint)size != uVar9);
    }
    pxVar8 = ctxt->node;
    if (pxVar8 == (xmlNodePtr)0x0) goto LAB_0013f12f;
    pxVar3 = ctxt->myDoc;
    if (pxVar3 != (xmlDocPtr)0x0) {
      if (pxVar8->ns == (xmlNs *)0x0) {
        pxVar10 = (xmlChar *)0x0;
      }
      else {
        pxVar10 = pxVar8->ns->prefix;
      }
      if (((pxVar3->intSubset != (_xmlDtd *)0x0) &&
          (pvVar7 = xmlHashLookup2((xmlHashTablePtr)pxVar3->intSubset->elements,pxVar8->name,pxVar10
                                  ), pvVar7 != (void *)0x0)) ||
         ((pxVar3->extSubset != (_xmlDtd *)0x0 &&
          (pvVar7 = xmlHashLookup2((xmlHashTablePtr)pxVar3->extSubset->elements,ctxt->node->name,
                                   pxVar10), pvVar7 != (void *)0x0)))) {
        if (*(int *)((long)pvVar7 + 0x48) - 2U < 2) goto LAB_0013f12f;
        if (*(int *)((long)pvVar7 + 0x48) == 4) goto LAB_0013f244;
      }
    }
    pxVar10 = ctxt->input->cur;
    xVar1 = *pxVar10;
    if (((xVar1 == '<') || (xVar1 == '\r')) &&
       ((xVar1 != '<' || ((ctxt->node->children != (_xmlNode *)0x0 || (pxVar10[1] != '/')))))) {
      pxVar8 = xmlGetLastChild(ctxt->node);
      if (pxVar8 == (xmlNodePtr)0x0) {
        if ((ctxt->node->type == XML_ELEMENT_NODE) || (ctxt->node->content == (xmlChar *)0x0))
        goto LAB_0013f244;
      }
      else {
        iVar6 = xmlNodeIsText(pxVar8);
        if ((iVar6 == 0) &&
           ((node = ctxt->node->children, node == (xmlNode *)0x0 ||
            (iVar6 = xmlNodeIsText(node), iVar6 == 0)))) {
LAB_0013f244:
          UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
          if (UNRECOVERED_JUMPTABLE == (ignorableWhitespaceSAXFunc)0x0) {
            return;
          }
          if (ctxt->keepBlanks == 0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)(ctxt->userData,buf,size);
          return;
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
LAB_0013f12f:
  p_Var4 = ctxt->sax->characters;
  if (p_Var4 != (charactersSAXFunc)0x0) {
    (*p_Var4)(ctxt->userData,buf,size);
  }
  if ((bVar5) && (*ctxt->space == -1)) {
    *ctxt->space = -2;
  }
  return;
}

Assistant:

static void
xmlCharacters(xmlParserCtxtPtr ctxt, const xmlChar *buf, int size,
              int isBlank) {
    int checkBlanks;

    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    checkBlanks = (!ctxt->keepBlanks) ||
                  (ctxt->sax->ignorableWhitespace != ctxt->sax->characters);

    /*
     * Calling areBlanks with only parts of a text node
     * is fundamentally broken, making the NOBLANKS option
     * essentially unusable.
     */
    if ((checkBlanks) &&
        (areBlanks(ctxt, buf, size, isBlank))) {
        if ((ctxt->sax->ignorableWhitespace != NULL) &&
            (ctxt->keepBlanks))
            ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
    } else {
        if (ctxt->sax->characters != NULL)
            ctxt->sax->characters(ctxt->userData, buf, size);

        /*
         * The old code used to update this value for "complex" data
         * even if checkBlanks was false. This was probably a bug.
         */
        if ((checkBlanks) && (*ctxt->space == -1))
            *ctxt->space = -2;
    }
}